

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2num(long *val,char *str)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  char *endptr;
  char *local_30;
  
  if (str == (char *)0x0) {
    return PARAM_BAD_NUMERIC;
  }
  local_30 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  sVar4 = strtol(str,&local_30,10);
  pcVar2 = local_30;
  if (*piVar3 == 0x22) {
    sVar5 = 0x11;
  }
  else {
    bVar1 = true;
    sVar5 = sVar4;
    if ((local_30 == str) || (sVar5 = strlen(str), pcVar2 != str + sVar5)) goto LAB_001198a9;
    *val = sVar4;
    sVar5 = 0;
  }
  bVar1 = false;
LAB_001198a9:
  if (bVar1) {
    return PARAM_BAD_NUMERIC;
  }
  return (ParameterError)sVar5;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr = NULL;
    long num;
    errno = 0;
    num = strtol(str, &endptr, 10);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}